

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthash.cpp
# Opt level: O3

uint64_t fasthash64(void *buf,size_t len,uint64_t seed)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  
  uVar2 = len * -0x77fcaa0de192e69b ^ seed;
  pbVar4 = (byte *)buf;
  if (7 < len) {
    uVar5 = 0;
    pbVar4 = (byte *)((len & 0xfffffffffffffff8) + (long)buf);
    do {
      puVar1 = (ulong *)((long)buf + uVar5);
      uVar5 = uVar5 + 8;
      uVar3 = (*puVar1 >> 0x17 ^ *puVar1) * 0x2127599bf4325c37;
      uVar2 = (uVar2 ^ uVar3 ^ uVar3 >> 0x2f) * -0x77fcaa0de192e69b;
    } while ((len & 0xfffffffffffffff8) != uVar5);
  }
  uVar5 = 0;
  switch((uint)len & 7) {
  case 7:
    uVar5 = (ulong)pbVar4[6] << 0x30;
  case 6:
    uVar5 = uVar5 | (ulong)pbVar4[5] << 0x28;
  case 5:
    uVar5 = uVar5 ^ (ulong)pbVar4[4] << 0x20;
  case 4:
    uVar5 = uVar5 ^ (ulong)pbVar4[3] << 0x18;
  case 3:
    uVar5 = uVar5 ^ (ulong)pbVar4[2] << 0x10;
  case 2:
    uVar5 = uVar5 ^ (ulong)pbVar4[1] << 8;
  case 1:
    uVar5 = (uVar5 >> 0x17 ^ uVar5 ^ (ulong)*pbVar4) * 0x2127599bf4325c37;
    uVar2 = (uVar5 >> 0x2f ^ uVar2 ^ uVar5) * -0x77fcaa0de192e69b;
  case 0:
    uVar2 = (uVar2 >> 0x17 ^ uVar2) * 0x2127599bf4325c37;
    return uVar2 >> 0x2f ^ uVar2;
  }
}

Assistant:

uint64_t fasthash64(const void *buf, size_t len, uint64_t seed)
{
	const uint64_t    m = 0x880355f21e6d1965ULL;
	const uint64_t *pos = (const uint64_t *)buf;
	const uint64_t *end = pos + (len / 8);
	const unsigned char *pos2;
	uint64_t h = seed ^ (len * m);
	uint64_t v;

	while (pos != end) {
		v  = *pos++;
		h ^= mix(v);
		h *= m;
	}

	pos2 = (const unsigned char*)pos;
	v = 0;

	switch (len & 7) {
	case 7: v ^= (uint64_t)pos2[6] << 48;
	case 6: v ^= (uint64_t)pos2[5] << 40;
	case 5: v ^= (uint64_t)pos2[4] << 32;
	case 4: v ^= (uint64_t)pos2[3] << 24;
	case 3: v ^= (uint64_t)pos2[2] << 16;
	case 2: v ^= (uint64_t)pos2[1] << 8;
	case 1: v ^= (uint64_t)pos2[0];
		h ^= mix(v);
		h *= m;
	}

	return mix(h);
}